

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::GeometryHelper_Extend_PolylineIdxToLineIdx
          (X3DImporter *this,list<int,_std::allocator<int>_> *pPolylineCoordIdx,
          list<int,_std::allocator<int>_> *pLineCoordIdx)

{
  list<int,_std::allocator<int>_> *plVar1;
  undefined8 in_RAX;
  _Self __tmp;
  list<int,_std::allocator<int>_> *plVar2;
  list<int,_std::allocator<int>_> *__x;
  undefined8 uStack_38;
  
  plVar2 = *(list<int,_std::allocator<int>_> **)pPolylineCoordIdx;
  uStack_38 = in_RAX;
  do {
    if (plVar2 == pPolylineCoordIdx) {
      return;
    }
    __x = plVar2 + 0x10;
    plVar1 = *(list<int,_std::allocator<int>_> **)plVar2;
    while( true ) {
      plVar2 = plVar1;
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                (pLineCoordIdx,(value_type_conflict *)__x);
      __x = plVar2 + 0x10;
      if ((plVar2 == pPolylineCoordIdx) || (*(int *)(plVar2 + 0x10) == -1)) break;
      plVar1 = *(list<int,_std::allocator<int>_> **)plVar2;
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                (pLineCoordIdx,(value_type_conflict *)__x);
      uStack_38 = CONCAT44(0xffffffff,(undefined4)uStack_38);
      std::__cxx11::list<int,_std::allocator<int>_>::push_back
                (pLineCoordIdx,(value_type_conflict *)((long)&uStack_38 + 4));
      if ((*(int *)(plVar1 + 0x10) == -1) || (plVar1 == pPolylineCoordIdx)) break;
    }
  } while( true );
}

Assistant:

void X3DImporter::GeometryHelper_Extend_PolylineIdxToLineIdx(const std::list<int32_t>& pPolylineCoordIdx, std::list<int32_t>& pLineCoordIdx)
{
    std::list<int32_t>::const_iterator plit = pPolylineCoordIdx.begin();

	while(plit != pPolylineCoordIdx.end())
	{
		// add first point of polyline
		pLineCoordIdx.push_back(*plit++);
		while((*plit != (-1)) && (plit != pPolylineCoordIdx.end()))
		{
			std::list<int32_t>::const_iterator plit_next;

			plit_next = plit, ++plit_next;
			pLineCoordIdx.push_back(*plit);// second point of previous line.
			pLineCoordIdx.push_back(-1);// delimiter
			if((*plit_next == (-1)) || (plit_next == pPolylineCoordIdx.end())) break;// current polyline is finished

			pLineCoordIdx.push_back(*plit);// first point of next line.
			plit = plit_next;
		}// while((*plit != (-1)) && (plit != pPolylineCoordIdx.end()))
	}// while(plit != pPolylineCoordIdx.end())
}